

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::vector3h>
          (Attribute *this,double t,vector3h *dst,TimeSampleInterpolationType tinterp)

{
  vtable_type *pvVar1;
  uint32_t uVar2;
  optional<tinyusdz::value::vector3h> local_38;
  undefined4 local_2f;
  uint16_t local_2b;
  double local_28;
  
  if (dst == (vector3h *)0x0) {
    return false;
  }
  if ((NAN(t)) &&
     ((local_28 = t, (this->_var)._blocked != false ||
      (((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
        (uVar2 = (*pvVar1->type_id)(), t = local_28, uVar2 != 0)) &&
       ((pvVar1 = (this->_var)._value.v_.vtable, pvVar1 == (vtable_type *)0x0 ||
        (uVar2 = (*pvVar1->type_id)(), t = local_28, uVar2 != 1)))))))) {
    primvar::PrimVar::get_value<tinyusdz::value::vector3h>(&local_38,&this->_var);
    if (local_38.has_value_ == true) {
      local_2b = local_38.contained._4_2_;
      local_2f = local_38.contained._0_4_;
      (dst->z).value = local_38.contained._4_2_;
      dst->x = (half)local_38.contained._0_2_;
      dst->y = (half)local_38.contained._2_2_;
    }
    t = local_28;
    if (local_38.has_value_ != false) {
      return true;
    }
  }
  if ((this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->_var)._ts._samples.
      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    primvar::PrimVar::get_value<tinyusdz::value::vector3h>(&local_38,&this->_var);
    if (local_38.has_value_ == true) {
      (dst->z).value = local_38.contained._4_2_;
      dst->x = (half)local_38.contained._0_2_;
      dst->y = (half)local_38.contained._2_2_;
    }
  }
  else {
    local_38.has_value_ =
         primvar::PrimVar::get_interpolated_value<tinyusdz::value::vector3h>
                   (&this->_var,t,tinterp,dst);
  }
  return local_38.has_value_;
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }